

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

void __thiscall slang::driver::Driver::reportMacros(Driver *this)

{
  DefineDirectiveSyntax *pDVar1;
  string_view text;
  pointer pSVar2;
  pointer ppDVar3;
  _Alloc_hider this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  Token TVar4;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar5;
  string_view text_00;
  format_args args;
  string_view fmt;
  size_t sVar6;
  char *pcVar7;
  BumpAllocator alloc;
  SyntaxPrinter local_5b8;
  _Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  local_588;
  vector<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_> buffers;
  undefined8 local_548;
  undefined8 uStack_540;
  string local_530;
  undefined8 local_510;
  undefined8 uStack_508;
  Bag optionBag;
  Diagnostics diagnostics;
  Preprocessor preprocessor;
  
  boost::unordered::
  unordered_flat_map<std::type_index,_std::any,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::unordered_flat_map(&optionBag.items);
  addParseOptions(this,&optionBag);
  BumpAllocator::BumpAllocator(&alloc);
  diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.
  data_ = (pointer)diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                   super_SmallVectorBase<slang::Diagnostic>.firstElement;
  diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.len
       = 0;
  diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.super_SmallVectorBase<slang::Diagnostic>.cap
       = 2;
  sVar6 = 0;
  pcVar7 = (char *)0x0;
  parsing::Preprocessor::Preprocessor
            (&preprocessor,&this->sourceManager,&alloc,&diagnostics,&optionBag,
             (span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>)
             ZEXT816(0));
  SourceLoader::loadSources(&buffers,&this->sourceLoader);
  for (pSVar2 = buffers.
                super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pSVar2 != buffers.
                super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>.
                _M_impl.super__Vector_impl_data._M_start; pSVar2 = pSVar2 + -1) {
    sVar6 = pSVar2[-1].data._M_len;
    pcVar7 = pSVar2[-1].data._M_str;
    parsing::Preprocessor::pushSource(&preprocessor,pSVar2[-1]);
  }
  do {
    TVar4 = parsing::Preprocessor::next(&preprocessor);
  } while (TVar4.kind != EndOfFile);
  this_00._M_p = (pointer)&preprocessor;
  parsing::Preprocessor::getDefinedMacros
            ((vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
              *)&local_588,(Preprocessor *)this_00._M_p);
  for (ppDVar3 = local_588._M_impl.super__Vector_impl_data._M_start;
      ppDVar3 != local_588._M_impl.super__Vector_impl_data._M_finish; ppDVar3 = ppDVar3 + 1) {
    pDVar1 = *ppDVar3;
    local_5b8.buffer._M_dataplus._M_p = (pointer)&local_5b8.buffer.field_2;
    local_5b8.buffer._M_string_length = 0;
    local_5b8.buffer.field_2._M_local_buf[0] = '\0';
    local_5b8.sourceManager = (SourceManager *)0x0;
    local_5b8.includePreprocessed = true;
    local_5b8.includeComments = false;
    local_5b8.squashNewlines = true;
    local_5b8.includeTrivia = false;
    local_5b8.includeMissing = false;
    local_5b8.includeSkipped = false;
    local_5b8.includeDirectives = false;
    TVar4.kind = (pDVar1->name).kind;
    TVar4._2_1_ = (pDVar1->name).field_0x2;
    TVar4.numFlags.raw = (pDVar1->name).numFlags.raw;
    TVar4.rawLen = (pDVar1->name).rawLen;
    TVar4.info = (pDVar1->name).info;
    slang::syntax::SyntaxPrinter::print(&local_5b8,TVar4);
    local_5b8.includeTrivia = true;
    if (pDVar1->formalArguments != (MacroFormalArgumentListSyntax *)0x0) {
      slang::syntax::SyntaxPrinter::print(&local_5b8,&pDVar1->formalArguments->super_SyntaxNode);
    }
    if ((pDVar1->body).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
        _M_extent_value != 0) {
      sVar5 = parsing::Token::trivia
                        ((pDVar1->body).super_span<slang::parsing::Token,_18446744073709551615UL>.
                         _M_ptr);
      if (sVar5._M_extent._M_extent_value._M_extent_value == 0) {
        text_00._M_str = " ";
        text_00._M_len = 1;
        slang::syntax::SyntaxPrinter::append(&local_5b8,text_00);
      }
    }
    slang::syntax::SyntaxPrinter::print
              (&local_5b8,&(pDVar1->body).super_SyntaxListBase.super_SyntaxNode);
    std::__cxx11::string::string((string *)&local_510,&local_5b8.buffer);
    local_548 = local_510;
    uStack_540 = uStack_508;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_548;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x3;
    ::fmt::v11::vformat_abi_cxx11_(&local_530,(v11 *)0x40eba7,fmt,args);
    text._M_str = pcVar7;
    text._M_len = sVar6;
    this_00._M_p = local_530._M_dataplus._M_p;
    OS::print(text);
    std::__cxx11::string::~string((string *)&local_530);
    std::__cxx11::string::~string((string *)&local_510);
    std::__cxx11::string::~string((string *)&local_5b8);
  }
  std::
  _Vector_base<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  ::~_Vector_base(&local_588);
  std::_Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>::~_Vector_base
            (&buffers.super__Vector_base<slang::SourceBuffer,_std::allocator<slang::SourceBuffer>_>)
  ;
  parsing::Preprocessor::~Preprocessor(&preprocessor);
  SmallVectorBase<slang::Diagnostic>::cleanup
            ((SmallVectorBase<slang::Diagnostic> *)&diagnostics,(EVP_PKEY_CTX *)this_00._M_p);
  BumpAllocator::~BumpAllocator(&alloc);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                 *)&optionBag);
  return;
}

Assistant:

void Driver::reportMacros() {
    Bag optionBag;
    addParseOptions(optionBag);

    BumpAllocator alloc;
    Diagnostics diagnostics;
    Preprocessor preprocessor(sourceManager, alloc, diagnostics, optionBag);

    auto buffers = sourceLoader.loadSources();
    for (auto it = buffers.rbegin(); it != buffers.rend(); it++)
        preprocessor.pushSource(*it);

    while (true) {
        Token token = preprocessor.next();
        if (token.kind == TokenKind::EndOfFile)
            break;
    }

    for (auto macro : preprocessor.getDefinedMacros()) {
        SyntaxPrinter printer;
        printer.setIncludeComments(false);
        printer.setIncludeTrivia(false);
        printer.print(macro->name);

        printer.setIncludeTrivia(true);
        if (macro->formalArguments)
            printer.print(*macro->formalArguments);

        if (!macro->body.empty() && macro->body[0].trivia().empty())
            printer.append(" "sv);

        printer.print(macro->body);

        OS::print(fmt::format("{}\n", printer.str()));
    }
}